

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

void trt_pose::parse::munkresStep1
               (float *cost_graph,int M,PairGraph *star_graph,int nrows,int ncols)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < nrows) {
    piVar1 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if (0 < ncols) {
        piVar2 = (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = 0;
        do {
          if ((((piVar1[uVar4] < 0) && (piVar2[uVar3] < 0)) && (cost_graph[uVar3] == 0.0)) &&
             (!NAN(cost_graph[uVar3]))) {
            piVar1[uVar4] = (int)uVar3;
            piVar2[uVar3] = (int)uVar4;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)ncols != uVar3);
      }
      uVar4 = uVar4 + 1;
      cost_graph = cost_graph + M;
    } while (uVar4 != (uint)nrows);
  }
  return;
}

Assistant:

void munkresStep1(const float *cost_graph, const int M, PairGraph &star_graph,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!star_graph.isRowSet(i) && !star_graph.isColSet(j) &&
          (cost_graph[i * M + j] == 0)) {
        star_graph.set(i, j);
      }
    }
  }
}